

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.hpp
# Opt level: O3

void njoy::tools::disco::Character<66u>::
     write<std::__cxx11::string,std::back_insert_iterator<std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = (int)value->_M_string_length + -0x42;
  iVar3 = 0;
  if (iVar4 != 0 && value->_M_string_length < 0x42) {
    uVar1 = 0xffffffff;
    do {
      uVar2 = uVar1;
      std::__cxx11::string::push_back((char)iter->container);
      uVar1 = uVar2 + 1;
    } while (uVar2 + 2 < (uint)-iVar4);
    if (0x40 < uVar2 + 1) {
      return;
    }
    iVar3 = uVar2 + 2;
  }
  iVar4 = 0;
  do {
    std::__cxx11::string::push_back((char)iter->container);
    iVar4 = iVar4 + 1;
  } while (0x42 - iVar3 != iVar4);
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    unsigned int position = 0;
    const unsigned int difference = value.size() >= Width ? 0 : Width - value.size();
    while ( position < difference ) {

      ++position;
      *iter++ = ' ';
    }
    auto viter = value.begin();
    while ( position < Width ) {

      ++position;
      *iter++ = *viter++;
    }
  }